

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

stack * stack_create(void)

{
  stack *psVar1;
  
  psVar1 = (stack *)calloc(1,0x10);
  return psVar1;
}

Assistant:

struct stack *stack_create(void)
{
        struct stack *stack = malloc(sizeof(struct stack));

        if (stack == NULL) {
                return NULL;
        }

        stack->length = 0;
        stack->head = NULL;

        return stack;
}